

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6ff79::dot_grad_test_calculation_Test::TestBody
          (dot_grad_test_calculation_Test *this)

{
  bool bVar1;
  double *pdVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  matrix grad_W;
  matrix grad_x;
  dotgrad_ret_type res;
  array<unsigned_int,_2UL> local_e8;
  AssertHelper local_e0;
  internal local_d8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  tensor<double,_2U> local_c8;
  tensor<double,_2U> local_98;
  dotgrad_ret_type local_68;
  
  dnet::nn::cal_dot_grad
            (&local_68,(this->super_dot_grad_test)._W,(this->super_dot_grad_test)._x,
             (this->super_dot_grad_test)._grad_y);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_c8._data,(vector<double,_std::allocator<double>_> *)&local_68);
  local_c8._shape._M_elems[0] = local_68.grad_w.super_tensor<double,_2U>._shape._M_elems[0];
  local_c8._shape._M_elems[1] = local_68.grad_w.super_tensor<double,_2U>._shape._M_elems[1];
  local_c8._axes_sort._M_elems[0] = local_68.grad_w.super_tensor<double,_2U>._axes_sort._M_elems[0];
  local_c8._axes_sort._M_elems[1] = local_68.grad_w.super_tensor<double,_2U>._axes_sort._M_elems[1];
  local_c8._facts._M_elems[0] = local_68.grad_w.super_tensor<double,_2U>._facts._M_elems[0];
  local_c8._facts._M_elems[1] = local_68.grad_w.super_tensor<double,_2U>._facts._M_elems[1];
  std::vector<double,_std::allocator<double>_>::vector
            (&local_98._data,(vector<double,_std::allocator<double>_> *)&local_68.grad_x);
  local_98._shape._M_elems[0] = local_68.grad_x.super_tensor<double,_2U>._shape._M_elems[0];
  local_98._shape._M_elems[1] = local_68.grad_x.super_tensor<double,_2U>._shape._M_elems[1];
  local_98._axes_sort._M_elems[0] = local_68.grad_x.super_tensor<double,_2U>._axes_sort._M_elems[0];
  local_98._axes_sort._M_elems[1] = local_68.grad_x.super_tensor<double,_2U>._axes_sort._M_elems[1];
  local_98._facts._M_elems[0] = local_68.grad_x.super_tensor<double,_2U>._facts._M_elems[0];
  local_98._facts._M_elems[1] = local_68.grad_x.super_tensor<double,_2U>._facts._M_elems[1];
  local_e8._M_elems[0] = 0;
  local_e8._M_elems[1] = 0;
  pdVar2 = dnet::data_types::tensor<double,_2U>::operator[](&local_98,&local_e8);
  local_e0.data_._0_4_ = 0x46;
  testing::internal::CmpHelperEQ<double,int>
            (local_d8,"(grad_x[{0, 0}])","70",pdVar2,(int *)&local_e0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8._M_elems != (_Type)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_e8._M_elems != (_Type)0x0)) {
        (**(code **)(*(long *)local_e8._M_elems + 8))();
      }
      local_e8._M_elems[0] = 0;
      local_e8._M_elems[1] = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e8._M_elems[0] = 1;
  local_e8._M_elems[1] = 0;
  pdVar2 = dnet::data_types::tensor<double,_2U>::operator[](&local_98,&local_e8);
  local_e0.data_._0_4_ = 0x50;
  testing::internal::CmpHelperEQ<double,int>
            (local_d8,"(grad_x[{1, 0}])","80",pdVar2,(int *)&local_e0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x4c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8._M_elems != (_Type)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_e8._M_elems != (_Type)0x0)) {
        (**(code **)(*(long *)local_e8._M_elems + 8))();
      }
      local_e8._M_elems[0] = 0;
      local_e8._M_elems[1] = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e8._M_elems[0] = 2;
  local_e8._M_elems[1] = 0;
  pdVar2 = dnet::data_types::tensor<double,_2U>::operator[](&local_98,&local_e8);
  local_e0.data_._0_4_ = 0x5a;
  testing::internal::CmpHelperEQ<double,int>
            (local_d8,"(grad_x[{2, 0}])","90",pdVar2,(int *)&local_e0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x4d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8._M_elems != (_Type)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_e8._M_elems != (_Type)0x0)) {
        (**(code **)(*(long *)local_e8._M_elems + 8))();
      }
      local_e8._M_elems[0] = 0;
      local_e8._M_elems[1] = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e8._M_elems[0] = 0;
  local_e8._M_elems[1] = 0;
  pdVar2 = dnet::data_types::tensor<double,_2U>::operator[](&local_c8,&local_e8);
  local_e0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<double,int>
            (local_d8,"(grad_W[{0, 0}])","1",pdVar2,(int *)&local_e0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x4e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8._M_elems != (_Type)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_e8._M_elems != (_Type)0x0)) {
        (**(code **)(*(long *)local_e8._M_elems + 8))();
      }
      local_e8._M_elems[0] = 0;
      local_e8._M_elems[1] = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e8._M_elems[0] = 0;
  local_e8._M_elems[1] = 2;
  pdVar2 = dnet::data_types::tensor<double,_2U>::operator[](&local_c8,&local_e8);
  local_e0.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<double,int>
            (local_d8,"(grad_W[{0, 2}])","3",pdVar2,(int *)&local_e0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x4f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8._M_elems != (_Type)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_e8._M_elems != (_Type)0x0)) {
        (**(code **)(*(long *)local_e8._M_elems + 8))();
      }
      local_e8._M_elems[0] = 0;
      local_e8._M_elems[1] = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e8._M_elems = (_Type)&DAT_100000001;
  pdVar2 = dnet::data_types::tensor<double,_2U>::operator[](&local_c8,&local_e8);
  local_e0.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<double,int>
            (local_d8,"(grad_W[{1, 1}])","4",pdVar2,(int *)&local_e0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x50,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8._M_elems != (_Type)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_e8._M_elems != (_Type)0x0)) {
        (**(code **)(*(long *)local_e8._M_elems + 8))();
      }
      local_e8._M_elems[0] = 0;
      local_e8._M_elems[1] = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e8._M_elems = (_Type)&DAT_300000002;
  pdVar2 = dnet::data_types::tensor<double,_2U>::operator[](&local_c8,&local_e8);
  local_e0.data_._0_4_ = 0xc;
  testing::internal::CmpHelperEQ<double,int>
            (local_d8,"(grad_W[{2, 3}])","12",pdVar2,(int *)&local_e0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x51,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8._M_elems != (_Type)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_e8._M_elems != (_Type)0x0)) {
        (**(code **)(*(long *)local_e8._M_elems + 8))();
      }
      local_e8._M_elems[0] = 0;
      local_e8._M_elems[1] = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_98._data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98._data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c8._data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8._data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.grad_x.super_tensor<double,_2U>._data.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_68.grad_x.super_tensor<double,_2U>._data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.grad_w.super_tensor<double,_2U>._data.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_68.grad_w.super_tensor<double,_2U>._data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F(dot_grad_test, calculation)
    {
        auto res = cal_dot_grad(*_W, *_x, *_grad_y);
        auto grad_W = res.grad_w;
        auto grad_x = res.grad_x;
        EXPECT_EQ((grad_x[{0, 0}]), 70);
        EXPECT_EQ((grad_x[{1, 0}]), 80);
        EXPECT_EQ((grad_x[{2, 0}]), 90);
        EXPECT_EQ((grad_W[{0, 0}]), 1);
        EXPECT_EQ((grad_W[{0, 2}]), 3);
        EXPECT_EQ((grad_W[{1, 1}]), 4);
        EXPECT_EQ((grad_W[{2, 3}]), 12);
    }